

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorscreen.cpp
# Opt level: O1

void __thiscall
QEglFSEmulatorScreen::initFromJsonObject(QEglFSEmulatorScreen *this,QJsonObject *description)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  Format FVar7;
  ScreenOrientation SVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QJsonObject geometryObject;
  undefined8 local_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  QJsonValue::QJsonValue((QJsonValue *)&local_58,Null);
  QVar9.m_data = (char *)description;
  QVar9.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar9);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      uVar6 = QJsonValue::toInt((int)&local_58);
      this->m_id = uVar6;
    }
  }
  QVar10.m_data = (char *)description;
  QVar10.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar10);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 3) {
      QJsonValue::toString();
      pQVar1 = &((this->m_description).d.d)->super_QArrayData;
      pcVar2 = (this->m_description).d.ptr;
      (this->m_description).d.d = (Data *)local_78;
      (this->m_description).d.ptr = pcStack_70;
      qVar3 = (this->m_description).d.size;
      (this->m_description).d.size = local_68;
      local_78 = pQVar1;
      pcStack_70 = pcVar2;
      local_68 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
  }
  QVar11.m_data = (char *)description;
  QVar11.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar11);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 5) {
      local_80 = 0xaaaaaaaaaaaaaaaa;
      QJsonValue::toObject();
      QVar12.m_data = (char *)&local_80;
      QVar12.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar12);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).x1.m_i = iVar5;
        }
      }
      QVar13.m_data = (char *)&local_80;
      QVar13.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar13);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).y1.m_i = iVar5;
        }
      }
      QVar14.m_data = (char *)&local_80;
      QVar14.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar14);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).x2.m_i = iVar5 + (this->m_geometry).x1.m_i + -1;
        }
      }
      QVar15.m_data = (char *)&local_80;
      QVar15.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar15);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).y2.m_i = iVar5 + (this->m_geometry).y1.m_i + -1;
        }
      }
      QJsonObject::~QJsonObject((QJsonObject *)&local_80);
    }
  }
  QVar16.m_data = (char *)description;
  QVar16.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar16);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      iVar5 = QJsonValue::toInt((int)&local_58);
      this->m_depth = iVar5;
    }
  }
  QVar17.m_data = (char *)description;
  QVar17.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar17);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      FVar7 = QJsonValue::toInt((int)&local_58);
      this->m_format = FVar7;
    }
  }
  QVar18.m_data = (char *)description;
  QVar18.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar18);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 5) {
      local_80 = 0xaaaaaaaaaaaaaaaa;
      QJsonValue::toObject();
      QVar19.m_data = (char *)&local_80;
      QVar19.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar19);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_physicalSize).wd = (double)iVar5;
        }
      }
      QVar20.m_data = (char *)&local_80;
      QVar20.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar20);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      iVar5 = QJsonValue::type();
      if (iVar5 != 0x80) {
        iVar5 = QJsonValue::type();
        if (iVar5 == 2) {
          iVar5 = QJsonValue::toInt((int)&local_58);
          (this->m_physicalSize).ht = (double)iVar5;
        }
      }
      QJsonObject::~QJsonObject((QJsonObject *)&local_80);
    }
  }
  QVar21.m_data = (char *)description;
  QVar21.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar21);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      dVar4 = (double)QJsonValue::toDouble(0.0);
      this->m_refreshRate = (float)dVar4;
    }
  }
  QVar22.m_data = (char *)description;
  QVar22.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar22);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      SVar8 = QJsonValue::toInt((int)&local_58);
      this->m_nativeOrientation = SVar8;
    }
  }
  QVar23.m_data = (char *)description;
  QVar23.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar23);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  iVar5 = QJsonValue::type();
  if (iVar5 != 0x80) {
    iVar5 = QJsonValue::type();
    if (iVar5 == 2) {
      SVar8 = QJsonValue::toInt((int)&local_58);
      this->m_orientation = SVar8;
    }
  }
  QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSEmulatorScreen::initFromJsonObject(const QJsonObject &description)
{
    QJsonValue value;

    value = description.value("id"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_id = value.toInt();

    value = description.value("description"_L1);
    if (!value.isUndefined() && value.isString())
        m_description = value.toString();

    value = description.value("geometry"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject geometryObject = value.toObject();
        value = geometryObject.value("x"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setX(value.toInt());
        value = geometryObject.value("y"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setY(value.toInt());
        value = geometryObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setWidth(value.toInt());
        value = geometryObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setHeight(value.toInt());
    }

    value = description.value("depth"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_depth = value.toInt();

    value = description.value("format"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_format = static_cast<QImage::Format>(value.toInt());

    value = description.value("physicalSize"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject physicalSizeObject = value.toObject();
        value = physicalSizeObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setWidth(value.toInt());
        value = physicalSizeObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setHeight(value.toInt());
    }


    value = description.value("refreshRate"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_refreshRate = value.toDouble();

    value = description.value("nativeOrientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_nativeOrientation = static_cast<Qt::ScreenOrientation>(value.toInt());

    value = description.value("orientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_orientation = static_cast<Qt::ScreenOrientation>(value.toInt());
}